

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *param_3,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *r,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             *cStatus,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *rStatus,bool isOptimal)

{
  uint *puVar1;
  char cVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  pointer pnVar4;
  VarStatus *pVVar5;
  pointer pnVar6;
  type_conflict5 tVar7;
  bool bVar8;
  int iVar9;
  VarStatus VVar10;
  long lVar11;
  int _k;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aik;
  cpp_dec_float<50U,_int,_void> local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  VVar10 = cStatus->data[this->m_k];
  if (VVar10 == ON_UPPER) {
LAB_0027d227:
    cVar2 = this->m_strictUp;
joined_r0x0027d22f:
    if (cVar2 == '\0') {
      return;
    }
  }
  else {
    if (VVar10 != FIXED) {
      if (VVar10 != ON_LOWER) {
        return;
      }
      cVar2 = this->m_strictLo;
      goto joined_r0x0027d22f;
    }
    if (this->m_maxSense == true) {
      local_2c8.data._M_elems._0_8_ = local_2c8.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar7 = boost::multiprecision::operator>
                        ((r->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&local_2c8);
      if ((!tVar7) || (this->m_strictUp == false)) {
        aik.m_backend.data._M_elems[0] = 0;
        tVar7 = boost::multiprecision::operator<
                          ((r->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&aik);
        if ((!tVar7) || (this->m_strictLo == false)) goto LAB_0027d1d1;
      }
    }
    else {
LAB_0027d1d1:
      if (this->m_maxSense != false) {
        return;
      }
      result.m_backend.data._M_elems._0_8_ =
           result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar7 = boost::multiprecision::operator>
                        ((r->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&result);
      if ((!tVar7) || (this->m_strictLo == false)) {
        result_3.m_backend.data._M_elems._0_8_ =
             result_3.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar7 = boost::multiprecision::operator<
                          ((r->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + this->m_j,(int *)&result_3);
        if (!tVar7) {
          return;
        }
        goto LAB_0027d227;
      }
    }
  }
  local_2c8.data._M_elems._32_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 8);
  local_2c8.data._M_elems._0_8_ = *(undefined8 *)(this->m_kObj).m_backend.data._M_elems;
  local_2c8.data._M_elems._8_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 2);
  local_2c8.data._M_elems._16_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 4);
  local_2c8.data._M_elems._24_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 6);
  local_2c8.exp = (this->m_kObj).m_backend.exp;
  local_2c8.neg = (this->m_kObj).m_backend.neg;
  local_2c8.fpclass = (this->m_kObj).m_backend.fpclass;
  local_2c8.prec_elem = (this->m_kObj).m_backend.prec_elem;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](&aik,&(this->m_col).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_i);
  lVar11 = 0;
  for (lVar12 = 0;
      lVar12 < (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar12 = lVar12 + 1) {
    pNVar3 = (this->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar9 = *(int *)((long)(&pNVar3->val + 1) + lVar11);
    if (iVar9 != this->m_i) {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar3->val).m_backend.data._M_elems + lVar11),
                 &(y->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar9].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_2c8,&result.m_backend);
    }
    lVar11 = lVar11 + 0x3c;
  }
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems._24_5_ = 0;
  result.m_backend.data._M_elems[7]._1_3_ = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result.m_backend,&local_2c8,&aik.m_backend);
  iVar9 = this->m_i;
  pnVar4 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar4[iVar9].m_backend.data._M_elems + 8) =
       CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar4[iVar9].m_backend.data = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
  pnVar4[iVar9].m_backend.exp = result.m_backend.exp;
  pnVar4[iVar9].m_backend.neg = result.m_backend.neg;
  pnVar4[iVar9].m_backend.fpclass = result.m_backend.fpclass;
  pnVar4[iVar9].m_backend.prec_elem = result.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k),0.0);
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 10;
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0;
  result_2.m_backend.data._M_elems[2] = 0;
  result_2.m_backend.data._M_elems[3] = 0;
  result_2.m_backend.data._M_elems[4] = 0;
  result_2.m_backend.data._M_elems[5] = 0;
  result_2.m_backend.data._M_elems._24_5_ = 0;
  result_2.m_backend.data._M_elems[7]._1_3_ = 0;
  result_2.m_backend.data._M_elems._32_5_ = 0;
  result_2.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_2.m_backend,&local_2c8,&(this->m_aij).m_backend);
  result_3.m_backend.fpclass = cpp_dec_float_finite;
  result_3.m_backend.prec_elem = 10;
  result_3.m_backend.data._M_elems[0] = 0;
  result_3.m_backend.data._M_elems[1] = 0;
  result_3.m_backend.data._M_elems[2] = 0;
  result_3.m_backend.data._M_elems[3] = 0;
  result_3.m_backend.data._M_elems[4] = 0;
  result_3.m_backend.data._M_elems[5] = 0;
  result_3.m_backend.data._M_elems._24_5_ = 0;
  result_3.m_backend.data._M_elems[7]._1_3_ = 0;
  result_3.m_backend.data._M_elems._32_5_ = 0;
  result_3.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_3.m_backend,&result_2.m_backend,&aik.m_backend);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems._24_5_ = 0;
  result.m_backend.data._M_elems[7]._1_3_ = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result.m_backend,&(this->m_jObj).m_backend,&result_3.m_backend);
  iVar9 = this->m_j;
  pnVar4 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar4[iVar9].m_backend.data._M_elems + 8) =
       CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar4[iVar9].m_backend.data = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
  pnVar4[iVar9].m_backend.exp = result.m_backend.exp;
  pnVar4[iVar9].m_backend.neg = result.m_backend.neg;
  pnVar4[iVar9].m_backend.fpclass = result.m_backend.fpclass;
  pnVar4[iVar9].m_backend.prec_elem = result.m_backend.prec_elem;
  iVar9 = this->m_j;
  if (this->m_jFixed != false) {
    VVar10 = FIXED;
    goto LAB_0027d4ff;
  }
  pnVar4 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_188.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
  local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar9].m_backend.data;
  local_188.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 2);
  puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
  local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_188.m_backend.exp = pnVar4[iVar9].m_backend.exp;
  local_188.m_backend.neg = pnVar4[iVar9].m_backend.neg;
  local_188.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
  local_188.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_68,0,(type *)0x0);
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
  bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_188,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,&local_a0);
  if (bVar8) {
LAB_0027d4f8:
    iVar9 = this->m_j;
    VVar10 = ON_LOWER;
  }
  else {
    iVar9 = this->m_j;
    pnVar6 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar6[iVar9].m_backend.data._M_elems + 8);
    pnVar4 = pnVar6 + iVar9;
    local_1c8.m_backend.data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
    local_1c8.m_backend.data._M_elems[1] = (pnVar4->m_backend).data._M_elems[1];
    local_1c8.m_backend.data._M_elems[2] = (pnVar4->m_backend).data._M_elems[2];
    local_1c8.m_backend.data._M_elems[3] = (pnVar4->m_backend).data._M_elems[3];
    puVar1 = pnVar6[iVar9].m_backend.data._M_elems + 4;
    local_1c8.m_backend.data._M_elems[4] = *puVar1;
    local_1c8.m_backend.data._M_elems[5] = puVar1[1];
    local_1c8.m_backend.data._M_elems[6] = puVar1[2];
    local_1c8.m_backend.data._M_elems[7] = puVar1[3];
    local_1c8.m_backend.exp = pnVar6[iVar9].m_backend.exp;
    local_1c8.m_backend.neg = pnVar6[iVar9].m_backend.neg;
    local_1c8.m_backend.fpclass = pnVar6[iVar9].m_backend.fpclass;
    local_1c8.m_backend.prec_elem = pnVar6[iVar9].m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_d8,this);
    bVar8 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1c8,&local_d8);
    if (bVar8) {
      iVar9 = this->m_j;
      pnVar4 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_208.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 8);
      local_208.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar9].m_backend.data;
      local_208.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar4[iVar9].m_backend.data._M_elems + 2);
      puVar1 = pnVar4[iVar9].m_backend.data._M_elems + 4;
      local_208.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_208.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_208.m_backend.exp = pnVar4[iVar9].m_backend.exp;
      local_208.m_backend.neg = pnVar4[iVar9].m_backend.neg;
      local_208.m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
      local_208.m_backend.prec_elem = pnVar4[iVar9].m_backend.prec_elem;
      local_248.m_backend.data._M_elems[0] = (this->m_Lo_j).m_backend.data._M_elems[0];
      local_248.m_backend.data._M_elems[1] = (this->m_Lo_j).m_backend.data._M_elems[1];
      local_248.m_backend.data._M_elems[2] = (this->m_Lo_j).m_backend.data._M_elems[2];
      local_248.m_backend.data._M_elems[3] = (this->m_Lo_j).m_backend.data._M_elems[3];
      local_248.m_backend.data._M_elems[4] = (this->m_Lo_j).m_backend.data._M_elems[4];
      local_248.m_backend.data._M_elems[5] = (this->m_Lo_j).m_backend.data._M_elems[5];
      local_248.m_backend.data._M_elems[6] = (this->m_Lo_j).m_backend.data._M_elems[6];
      local_248.m_backend.data._M_elems[7] = (this->m_Lo_j).m_backend.data._M_elems[7];
      local_248.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 8);
      local_248.m_backend.exp = (this->m_Lo_j).m_backend.exp;
      local_248.m_backend.neg = (this->m_Lo_j).m_backend.neg;
      local_248.m_backend.fpclass = (this->m_Lo_j).m_backend.fpclass;
      local_248.m_backend.prec_elem = (this->m_Lo_j).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_110,this);
      bVar8 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_208,&local_248,&local_110);
      if (bVar8) goto LAB_0027d4f8;
    }
    iVar9 = this->m_j;
    VVar10 = ON_UPPER;
  }
LAB_0027d4ff:
  pVVar5 = cStatus->data;
  pVVar5[iVar9] = VVar10;
  pVVar5[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}